

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.hpp
# Opt level: O2

bool Covariance::Inverse<double>(double *A,int size)

{
  ulong uVar1;
  int i;
  void *pvVar2;
  long lVar3;
  int j_1;
  int iVar4;
  int j;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  void *pvVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  
  uVar1 = (ulong)(uint)size;
  pvVar2 = operator_new__((ulong)(uint)(size * size) << 3);
  dVar9 = recurse_determinant<double>(A,size);
  if (0.0 <= dVar9) {
    uVar7 = 0;
    uVar5 = uVar1;
    if (size < 1) {
      uVar5 = uVar7;
    }
    lVar3 = (long)size * 8;
    iVar4 = 2;
    pvVar8 = pvVar2;
    for (; uVar7 != uVar5; uVar7 = uVar7 + 1) {
      for (uVar6 = 0; uVar1 != uVar6; uVar6 = uVar6 + 1) {
        dVar10 = pow(-1.0,(double)(iVar4 + (int)uVar6));
        dVar11 = cofactor<double>(A,size,(int)uVar6,(int)uVar7);
        *(double *)((long)pvVar8 + uVar6 * 8) = (dVar11 / dVar9) * dVar10;
      }
      pvVar8 = (void *)((long)pvVar8 + lVar3);
      iVar4 = iVar4 + 1;
    }
    pvVar8 = pvVar2;
    for (uVar7 = 0; uVar7 != uVar5; uVar7 = uVar7 + 1) {
      for (uVar6 = 0; uVar1 != uVar6; uVar6 = uVar6 + 1) {
        A[uVar6] = *(double *)((long)pvVar8 + uVar6 * 8);
      }
      pvVar8 = (void *)((long)pvVar8 + lVar3);
      A = A + size;
    }
  }
  operator_delete__(pvVar2);
  return 0.0 <= dVar9;
}

Assistant:

bool Inverse(T* A, int size) {
      T* B   = new T[size*size];
      T  det = recurse_determinant<T>(A, size);

      if(det < T(0.0)) {
         delete[] B;
         return false;
      }

      for(int i=0; i<size; ++i)
         for(int j=0; j<size; ++j) {
            B[i*size + j] = pow(-1, i+j+2) * (cofactor<T>(A, size, j, i) / det);
         }

      for(int i=0; i<size; ++i)
         for(int j=0; j<size; ++j) {
            A[i*size +j] = B[i*size + j];
         }

      delete[] B;
      return true;
   }